

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O1

void __thiscall Entity::Entity(Entity *this,Attributes *attrs)

{
  Entity *pEVar1;
  undefined1 uVar2;
  uint16_t uVar3;
  undefined4 uVar4;
  uint8_t uVar5;
  Position PVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  size_type sVar16;
  mapped_type *pmVar17;
  size_type sVar18;
  
  uVar5 = attrs->type_id;
  PVar6 = attrs->position;
  uVar7 = attrs->orientation;
  uVar8 = attrs->palette;
  uVar9 = attrs->speed;
  bVar10 = attrs->fightable;
  bVar11 = attrs->liftable;
  bVar12 = attrs->can_pass_through;
  bVar13 = attrs->appear_after_player_moved_away;
  bVar14 = attrs->gravity_immune;
  bVar15 = attrs->talkable;
  uVar2 = attrs->field_0x11;
  uVar3 = attrs->behavior_id;
  uVar4 = *(undefined4 *)&attrs->field_0x14;
  pEVar1 = attrs->entity_to_use_tiles_from;
  (this->_attrs).dialogue = attrs->dialogue;
  (this->_attrs).field_0x11 = uVar2;
  (this->_attrs).behavior_id = uVar3;
  *(undefined4 *)&(this->_attrs).field_0x14 = uVar4;
  (this->_attrs).entity_to_use_tiles_from = pEVar1;
  (this->_attrs).type_id = uVar5;
  (this->_attrs).position = PVar6;
  (this->_attrs).orientation = uVar7;
  (this->_attrs).palette = uVar8;
  (this->_attrs).speed = uVar9;
  (this->_attrs).fightable = bVar10;
  (this->_attrs).liftable = bVar11;
  (this->_attrs).can_pass_through = bVar12;
  (this->_attrs).appear_after_player_moved_away = bVar13;
  (this->_attrs).gravity_immune = bVar14;
  (this->_attrs).talkable = bVar15;
  (this->_attrs).mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (attrs->mask_flags).super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->_attrs).mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (attrs->mask_flags).super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->_attrs).mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (attrs->mask_flags).super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (attrs->mask_flags).super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (attrs->mask_flags).super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (attrs->mask_flags).super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_attrs).persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  (this->_attrs).persistence_flag.byte = (attrs->persistence_flag).byte;
  (this->_attrs).persistence_flag.bit = (attrs->persistence_flag).bit;
  bVar10 = attrs->flag_unknown_2_4;
  (this->_attrs).flag_unknown_2_3 = attrs->flag_unknown_2_3;
  (this->_attrs).flag_unknown_2_4 = bVar10;
  (this->_attrs).flag_unknown_3_5 = attrs->flag_unknown_3_5;
  this->_map = (Map *)0x0;
  sVar16 = std::
           map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
           ::count(&DEFAULT_PALETTES,(key_type_conflict *)this);
  if (sVar16 != 0) {
    pmVar17 = std::
              map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
              ::at(&DEFAULT_PALETTES,(key_type_conflict *)this);
    (this->_attrs).palette = *pmVar17;
  }
  sVar18 = std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::count
                     (&LIFTABLE_TYPES,(key_type_conflict *)this);
  if (sVar18 != 0) {
    (this->_attrs).liftable = true;
  }
  sVar18 = std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::count
                     (&FIGHTABLE_TYPES,(key_type_conflict *)this);
  if (sVar18 != 0) {
    (this->_attrs).fightable = true;
  }
  sVar18 = std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::count
                     (&ENEMY_TYPES,(key_type_conflict *)this);
  if (sVar18 != 0) {
    (this->_attrs).speed = '\x01';
    (this->_attrs).fightable = true;
    (this->_attrs).behavior_id = 1;
  }
  return;
}

Assistant:

Entity::Entity(Attributes attrs) :
    _attrs  (std::move(attrs)),
    _map    (nullptr)
{
    if(DEFAULT_PALETTES.count(_attrs.type_id))
        _attrs.palette = DEFAULT_PALETTES.at(_attrs.type_id);

    if(LIFTABLE_TYPES.count(_attrs.type_id))
        _attrs.liftable = true;

    if(FIGHTABLE_TYPES.count(_attrs.type_id))
        _attrs.fightable = true;

    if(ENEMY_TYPES.count(_attrs.type_id))
    {
        _attrs.fightable = true;
        _attrs.speed = 1;
        _attrs.behavior_id = 1;
    }
}